

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.hpp
# Opt level: O2

unique_ptr<float[],_std::default_delete<float[]>_> __thiscall
qclab::dense::init_unique_array<float>(dense *this,int64_t size)

{
  void *__s;
  ulong __n;
  __uniq_ptr_impl<float,_std::default_delete<float[]>_> local_20;
  
  if (0 < size) {
    __n = -(ulong)((ulong)size >> 0x3e != 0) | size << 2;
    __s = operator_new__(__n);
    memset(__s,0,__n);
    *(void **)this = __s;
    local_20._M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
    super__Head_base<0UL,_float_*,_false>._M_head_impl =
         (tuple<float_*,_std::default_delete<float[]>_>)
         (_Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>)0x0;
    std::unique_ptr<float[],_std::default_delete<float[]>_>::~unique_ptr
              ((unique_ptr<float[],_std::default_delete<float[]>_> *)&local_20);
    return (__uniq_ptr_data<float,_std::default_delete<float[]>,_true,_true>)
           (__uniq_ptr_data<float,_std::default_delete<float[]>,_true,_true>)this;
  }
  __assert_fail("size > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/dense/memory.hpp"
                ,0x1e,"auto qclab::dense::init_unique_array(const int64_t) [T = float]");
}

Assistant:

inline auto init_unique_array( const int64_t size ) {
      assert( size > 0 ) ;
      std::unique_ptr< T[] > mem( new T[size]() ) ;
      assert( mem.get() != nullptr ) ;
      return mem ;
    }